

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O1

SQRESULT sqstd_writeclosuretofile(HSQUIRRELVM v,SQChar *filename)

{
  FILE *__stream;
  long lVar1;
  SQRESULT SVar2;
  
  __stream = fopen(filename,"wb+");
  if (__stream != (FILE *)0x0) {
    lVar1 = sq_writeclosure(v,file_write,__stream);
    fclose(__stream);
    return lVar1 >> 0x3f;
  }
  SVar2 = sq_throwerror(v,"cannot open the file");
  return SVar2;
}

Assistant:

SQRESULT sqstd_writeclosuretofile(HSQUIRRELVM v,const SQChar *filename)
{
    SQFILE file = sqstd_fopen(filename,_SC("wb+"));
    if(!file) return sq_throwerror(v,_SC("cannot open the file"));
    if(SQ_SUCCEEDED(sq_writeclosure(v,file_write,file))) {
        sqstd_fclose(file);
        return SQ_OK;
    }
    sqstd_fclose(file);
    return SQ_ERROR; //forward the error
}